

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

string * Catch::StringMaker<std::basic_string_view<char,std::char_traits<char>>,void>::
         convert_abi_cxx11_(string_view str)

{
  string *in_RDI;
  allocator<char> local_41;
  string local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_20,&local_41);
  StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(in_RDI,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return in_RDI;
}

Assistant:

std::string StringMaker<std::string_view>::convert(std::string_view str) {
    return ::Catch::Detail::stringify(std::string{ str });
}